

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<2>::IsIdentity(SquareMatrix<2> *this)

{
  float fVar1;
  long lVar2;
  int j;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  bVar6 = false;
  lVar2 = 0;
  do {
    lVar3 = 0;
    bVar4 = false;
    do {
      fVar1 = (*(Float (*) [2])*(Float (*) [2])this)[lVar3];
      if (lVar2 == lVar3) {
        bVar5 = fVar1 == 1.0;
      }
      else {
        bVar5 = fVar1 == 0.0;
      }
      if ((!bVar5) || (NAN(fVar1))) {
        if (!bVar4) {
          return bVar6;
        }
        break;
      }
      lVar3 = lVar3 + 1;
      bVar4 = lVar3 != 1;
    } while (lVar3 == 1);
    this = (SquareMatrix<2> *)((long)this + 8);
    bVar6 = lVar2 != 0;
    lVar2 = lVar2 + 1;
    if (bVar6) {
      return bVar6;
    }
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool IsIdentity() const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (i == j) {
                    if (m[i][j] != 1)
                        return false;
                } else if (m[i][j] != 0)
                    return false;
            }
        return true;
    }